

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.cc
# Opt level: O1

void init_big_int(module *m)

{
  PyObject *pPVar1;
  handle hVar2;
  object local_48;
  unique_function_record local_40;
  handle local_38;
  handle local_30;
  cpp_function func;
  
  pPVar1 = (m->super_object).super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_38.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"constant");
  if (local_38.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_38.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar2.m_ptr = local_38.m_ptr;
  local_30.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_40);
  *(code **)((long)local_40._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_big_int(pybind11::module_&)::$_0,std::shared_ptr<kratos::Var>,pybind11::object_const&,unsigned_long,bool,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::return_value_policy>(init_big_int(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::Var>(*)(pybind11::object_const&,unsigned_long,bool),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_40._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "constant";
  *(PyObject **)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70) =
       pPVar1;
  *(PyObject **)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78) =
       hVar2.m_ptr;
  *(undefined1 *)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x58) =
       5;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_30,&local_40,"({%}, {int}, {bool}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_big_int(pybind11::module_&)::$_0,std::shared_ptr<kratos::Var>,pybind11::object_const&,unsigned_long,bool,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::return_value_policy>(init_big_int(pybind11::module_&)::$_0&&,std::shared_ptr<kratos::Var>(*)(pybind11::object_const&,unsigned_long,bool),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
             ::types,3);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_40);
  pybind11::object::~object((object *)&local_38);
  pybind11::object::~object(&local_48);
  pybind11::module_::add_object(m,"constant",local_30,true);
  pybind11::object::~object((object *)&local_30);
  return;
}

Assistant:

void init_big_int(py::module &m) {
    m.def(
        "constant",
        [](const py::object &obj, uint64_t width, bool is_signed) {
            auto num_bits = _PyLong_NumBits(obj.ptr());

            if (num_bits > width)
                throw std::invalid_argument(
                    fmt::format("Width ({0}) too small for constant value", width));
            if (num_bits <= 64) {
                auto v = PyLong_AsLongLong(obj.ptr());
                auto &c = kratos::Const::constant(v, width, is_signed);
                return c.shared_from_this();
            }
            auto *format = _PyLong_Format(obj.ptr(), 16);
            auto str_value = py::cast<std::string>(format);
            bool negative = false;
            if (str_value[0] == '-') {
                if (!is_signed)
                    throw std::invalid_argument(
                        "Constant value is signed but argument says otherwise");
                negative = true;
                str_value = str_value.substr(1);
            }
            // remove 0x
            str_value = str_value.substr(2);
            auto &c = kratos::Const::constant(str_value, num_bits, negative, width, is_signed);
            return c.shared_from_this();
        },
        py::return_value_policy::reference);
}